

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  char *__ptr;
  size_t sStack_20;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    __ptr = "Failed to initialize GLFW\n";
    sStack_20 = 0x1a;
  }
  else {
    handle = glfwCreateWindow(200,200,"Window Icon",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSetKeyCallback(handle,key_callback);
      set_icon(handle,cur_icon_color);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(handle);
        glfwWaitEvents();
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
    __ptr = "Failed to open GLFW window\n";
    sStack_20 = 0x1b;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Window Icon", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    glfwSetKeyCallback(window, key_callback);
    set_icon(window, cur_icon_color);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwDestroyWindow(window);
    glfwTerminate();
    exit(EXIT_SUCCESS);
}